

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall pugi::xml_node::prepend_attribute(xml_node *this,char_t *name_)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_memory_page *pxVar3;
  xml_attribute_struct *attr;
  xml_attribute xVar4;
  uint uVar5;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  if (this->_root != (xml_node_struct *)0x0) {
    uVar1 = this->_root->header;
    uVar5 = (uint)uVar1 & 7;
    if ((uVar5 == 1) || (uVar5 == 6)) {
      this_00 = *(xml_allocator **)(uVar1 & 0xffffffffffffffe0);
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x8001) {
        xVar4._attr = (xml_attribute_struct *)this_00->_root;
        attr = (xml_attribute_struct *)
               (((xml_memory_page *)xVar4._attr)->data + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        attr = (xml_attribute_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x28,(xml_memory_page **)&local_20);
        xVar4._attr = local_20._attr;
      }
      attr->header = (uintptr_t)xVar4._attr;
      attr->name = (char_t *)0x0;
      attr->value = (char_t *)0x0;
      attr->prev_attribute_c = (xml_attribute_struct *)0x0;
      attr->next_attribute = (xml_attribute_struct *)0x0;
      xml_attribute::xml_attribute(&local_20,attr);
      if ((xml_memory_page *)local_20._attr != (xml_memory_page *)0x0) {
        pxVar2 = this->_root;
        pxVar3 = (xml_memory_page *)pxVar2->first_attribute;
        xVar4._attr = local_20._attr;
        if (pxVar3 != (xml_memory_page *)0x0) {
          (local_20._attr)->prev_attribute_c = (xml_attribute_struct *)pxVar3->next;
          xVar4._attr = (xml_attribute_struct *)pxVar3;
        }
        ((xml_memory_page *)xVar4._attr)->next = (xml_memory_page *)local_20._attr;
        (local_20._attr)->next_attribute = (xml_attribute_struct *)pxVar3;
        pxVar2->first_attribute = local_20._attr;
        impl::anon_unknown_0::strcpy_insitu
                  (&(local_20._attr)->name,&(local_20._attr)->header,0x10,name_);
        return (xml_attribute)local_20._attr;
      }
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? static_cast<xml_node_type>((_root->header & impl::xml_memory_page_type_mask) + 1) : node_null;
	}